

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  size_t sVar1;
  double *__dest;
  double *__dest_00;
  double *__dest_01;
  ulong uVar2;
  char *__format;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *local_60;
  
  dVar5 = pow(eps,0.3333333333333333);
  sVar1 = (long)N * 8;
  __dest = (double *)malloc(sVar1);
  __dest_00 = (double *)malloc(sVar1);
  __dest_01 = (double *)malloc(sVar1);
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
    sVar1 = uVar2 * 8;
    uVar3 = 0;
    local_60 = f;
    do {
      dVar6 = x[uVar3];
      if (ABS(dVar6) < 1.0 / ABS(dx[uVar3])) {
        dVar6 = signx(dVar6);
        dVar6 = dVar6 / ABS(dx[uVar3]);
      }
      dVar6 = dVar6 * dVar5;
      memcpy(__dest,x,sVar1);
      memcpy(__dest_00,x,sVar1);
      memcpy(__dest_01,x,sVar1);
      __dest[uVar3] = __dest[uVar3] + dVar6;
      __dest_01[uVar3] = __dest_01[uVar3] + dVar6;
      uVar4 = 0;
      do {
        dVar7 = x[uVar4];
        if (ABS(dVar7) < 1.0 / ABS(dx[uVar4])) {
          dVar7 = signx(dVar7);
          dVar7 = dVar7 / ABS(dx[uVar4]);
        }
        dVar7 = dVar7 * dVar5;
        __dest_00[uVar4] = __dest_00[uVar4] + dVar7;
        __dest_01[uVar4] = __dest_01[uVar4] + dVar7;
        dVar8 = (*funcpt->funcpt)(__dest_01,N,funcpt->params);
        dVar9 = (*funcpt->funcpt)(__dest,N,funcpt->params);
        dVar10 = (*funcpt->funcpt)(__dest_00,N,funcpt->params);
        dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
        dVar8 = ((dVar8 - dVar9) - (dVar10 - dVar11)) / (dVar6 * dVar7);
        local_60[uVar4] = dVar8;
        if (1.79769313486232e+308 <= ABS(dVar8)) {
          __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0012405c:
          printf(__format);
          free(__dest);
          free(__dest_00);
          free(__dest_01);
          return 0xf;
        }
        if (NAN(dVar8)) {
          __format = "Program Exiting as the function returns NaN";
          goto LAB_0012405c;
        }
        __dest_00[uVar4] = __dest_00[uVar4] - dVar7;
        __dest_01[uVar4] = __dest_01[uVar4] - dVar7;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      uVar3 = uVar3 + 1;
      local_60 = local_60 + uVar2;
    } while (uVar3 != uVar2);
  }
  free(__dest);
  free(__dest_00);
  free(__dest_01);
  return 0;
}

Assistant:

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,retval;
	double stepi,stepj,fd,stepmax;
	double *xi,*xj,*xij;
	
	retval = 0;

	fd = pow((double) eps,1.0/3.0);
	xi = (double*) malloc(sizeof(double) *N);
	xj = (double*) malloc(sizeof(double) *N);
	xij = (double*) malloc(sizeof(double) *N);
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepi = fd * stepmax;
		for(j = 0; j < N;++j) {
			xi[j] = x[j];
			xj[j]= x[j];
			xij[j] = x[j];
		}
		xi[i] += stepi;
		xij[i] += stepi;
		for(j = 0; j < N;++j) {
			if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
				stepmax = x[j];
			} else {
				stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
			}
			stepj = fd * stepmax;
			xj[j] += stepj;
			xij[j] += stepj;

			f[i*N+j] = ((FUNCPT_EVAL(funcpt,xij,N) - FUNCPT_EVAL(funcpt,xi,N)) - (FUNCPT_EVAL(funcpt,xj,N) - FUNCPT_EVAL(funcpt,x,N)))/(stepi * stepj);
			if (f[i*N+j] >= DBL_MAX || f[i*N+j] <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			if (f[i*N+j] != f[i*N+j]) {
				printf("Program Exiting as the function returns NaN");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			xj[j] -= stepj;
			xij[j] -= stepj;
		}

	}
	
	free(xi);
	free(xj);
	free(xij);
	return retval;
	
}